

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * strPadLeft(string *__return_storage_ptr__,string *str,size_t newSize,char filler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = (int)newSize - (int)str->_M_string_length;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (0 < iVar2) {
    do {
      std::__cxx11::string::push_back((char)&local_50);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::operator+(__return_storage_ptr__,&local_50,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string strPadLeft(const string& str, const size_t newSize, const char filler)
{
    const int cnt = static_cast<int>(newSize - str.size());
    string prefix;
    for (int i = 0; i < cnt; i++) prefix += filler;
    return prefix + str;
}